

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O2

Own<capnp::_::RpcSystemBase::Impl> __thiscall
kj::
heap<capnp::_::RpcSystemBase::Impl,capnp::_::VatNetworkBase&,capnp::_::BootstrapFactoryBase&,kj::Maybe<capnp::RealmGateway<capnp::AnyPointer,capnp::AnyPointer,capnp::AnyPointer,capnp::AnyPointer>::Client>>
          (kj *this,VatNetworkBase *params,BootstrapFactoryBase *params_1,
          Maybe<capnp::RealmGateway<capnp::AnyPointer,_capnp::AnyPointer,_capnp::AnyPointer,_capnp::AnyPointer>::Client>
          *params_2)

{
  code *pcVar1;
  _func_int *p_Var2;
  Impl *this_00;
  Impl *extraout_RDX;
  Own<capnp::_::RpcSystemBase::Impl> OVar3;
  undefined1 local_48 [32];
  
  this_00 = (Impl *)operator_new(0xd0);
  local_48[0] = (params_2->ptr).isSet;
  if (local_48[0] == true) {
    p_Var2 = (params_2->ptr).field_1.value._vptr_Client[-3];
    pcVar1 = p_Var2 + 8 + (long)&(params_2->ptr).isSet;
    local_48._16_8_ = *(undefined8 *)pcVar1;
    local_48._24_8_ = *(undefined8 *)(pcVar1 + 8);
    *(undefined8 *)(p_Var2 + 0x10 + (long)&(params_2->ptr).isSet) = 0;
    local_48._8_8_ =
         &capnp::
          RealmGateway<capnp::AnyPointer,capnp::AnyPointer,capnp::AnyPointer,capnp::AnyPointer>::
          Client::typeinfo;
  }
  capnp::_::RpcSystemBase::Impl::Impl
            (this_00,params,params_1,
             (Maybe<capnp::RealmGateway<capnp::AnyPointer,_capnp::AnyPointer,_capnp::AnyPointer,_capnp::AnyPointer>::Client>
              *)local_48);
  *(undefined8 **)this = &_::HeapDisposer<capnp::_::RpcSystemBase::Impl>::instance;
  *(Impl **)(this + 8) = this_00;
  _::
  NullableValue<capnp::RealmGateway<capnp::AnyPointer,_capnp::AnyPointer,_capnp::AnyPointer,_capnp::AnyPointer>::Client>
  ::~NullableValue((NullableValue<capnp::RealmGateway<capnp::AnyPointer,_capnp::AnyPointer,_capnp::AnyPointer,_capnp::AnyPointer>::Client>
                    *)local_48);
  OVar3.ptr = extraout_RDX;
  OVar3.disposer = (Disposer *)this;
  return OVar3;
}

Assistant:

Own<T> heap(Params&&... params) {
  // heap<T>(...) allocates a T on the heap, forwarding the parameters to its constructor.  The
  // exact heap implementation is unspecified -- for now it is operator new, but you should not
  // assume this.  (Since we know the object size at delete time, we could actually implement an
  // allocator that is more efficient than operator new.)

  return Own<T>(new T(kj::fwd<Params>(params)...), _::HeapDisposer<T>::instance);
}